

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

sample_type __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
::do_regular(jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
             *this,int32_t qs,int32_t param_2,int32_t predicted,decoder_strategy *param_4)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  uchar uVar4;
  int iVar5;
  int32_t k;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  context_regular_mode *this_00;
  
  iVar5 = -qs;
  if (0 < qs) {
    iVar5 = qs;
  }
  this_00 = (this->contexts_)._M_elems + iVar5;
  k = context_regular_mode::get_golomb_coding_parameter(this_00);
  uVar1 = (this->contexts_)._M_elems[iVar5].c_;
  uVar2 = (this->traits_).maximum_sample_value;
  uVar6 = decoder_strategy::peek_byte(&this->super_decoder_strategy);
  iVar3 = *(int32_t *)((long)k * 0x800 + 0x1401ac + (ulong)uVar6 * 8);
  if (iVar3 == 0) {
    uVar6 = decode_value(this,k,(this->traits_).limit,(this->traits_).quantized_bits_per_pixel);
    uVar6 = (int)uVar6 >> 1 ^ -(uVar6 & 1);
    uVar7 = -uVar6;
    if (0 < (int)uVar6) {
      uVar7 = uVar6;
    }
    if (0xffff < uVar7) {
      impl::throw_jpegls_error(InvalidCompressedData);
    }
  }
  else {
    decoder_strategy::skip(&this->super_decoder_strategy,iVar3);
    uVar6 = *(uint *)(decoding_tables + (ulong)uVar6 * 8 + (long)k * 0x800);
    uVar7 = -uVar6;
    if (0 < (int)uVar6) {
      uVar7 = uVar6;
    }
    if (0xfffe < uVar7) {
      __assert_fail("std::abs(error_value) < 65535",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                    ,0x13f,
                    "sample_type charls::jls_codec<charls::default_traits<unsigned char, charls::quad<unsigned char>>, charls::decoder_strategy>::do_regular(const int32_t, int32_t, const int32_t, decoder_strategy *) [Traits = charls::default_traits<unsigned char, charls::quad<unsigned char>>, Strategy = charls::decoder_strategy]"
                   );
    }
  }
  uVar7 = qs >> 0x1f;
  iVar3 = (this->traits_).near_lossless;
  if (k == 0) {
    uVar8 = 0;
    if (iVar3 == 0) {
      uVar8 = (this->contexts_)._M_elems[iVar5].n_ + (this->contexts_)._M_elems[iVar5].b_ * 2 + -1
              >> 0x1f;
    }
    uVar6 = uVar6 ^ uVar8;
  }
  uVar8 = ((uVar1 ^ uVar7) - uVar7) + predicted;
  uVar1 = 0;
  if (-1 < (int)uVar8) {
    uVar1 = uVar2;
  }
  if ((uVar8 & ~uVar2) == 0) {
    uVar1 = uVar8;
  }
  context_regular_mode::update_variables_and_bias
            (this_00,uVar6,iVar3,(this->traits_).reset_threshold);
  uVar4 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (&this->traits_,uVar1,(uVar6 ^ uVar7) - uVar7);
  return uVar4;
}

Assistant:

do_regular(const int32_t qs, int32_t /*x*/, const int32_t predicted,
                                        decoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};

        int32_t error_value;
        const golomb_code& code = decoding_tables[k].get(Strategy::peek_byte());
        if (code.length() != 0)
        {
            Strategy::skip(code.length());
            error_value = code.value();
            ASSERT(std::abs(error_value) < 65535);
        }
        else
        {
            error_value = unmap_error_value(decode_value(k, traits_.limit, traits_.quantized_bits_per_pixel));
            if (UNLIKELY(std::abs(error_value) > 65535))
                impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);
        }
        if (k == 0)
        {
            error_value = error_value ^ context.get_error_correction(traits_.near_lossless);
        }
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        error_value = apply_sign(error_value, sign);
        return traits_.compute_reconstructed_sample(predicted_value, error_value);
    }